

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

hugeint_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
          (Interpolator<false> *this,hugeint_t *v_t,Vector *result,
          QuantileDirect<duckdb::hugeint_t> *accessor)

{
  bool bVar1;
  idx_t iVar2;
  long lVar3;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_>_> __comp_01;
  idx_t iVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  hugeint_t hVar8;
  hugeint_t lo;
  hugeint_t hi;
  hugeint_t local_50;
  undefined1 local_40;
  undefined7 uStack_3f;
  hugeint_t local_38;
  
  bVar1 = this->desc;
  iVar7 = this->CRN;
  iVar4 = this->FRN;
  iVar2 = this->begin;
  iVar6 = this->end;
  local_40 = bVar1;
  if (iVar7 == iVar4) {
    local_50.upper = (int64_t)accessor;
    local_50.lower = (uint64_t)accessor;
    if (iVar7 != iVar6 && iVar2 != iVar6) {
      uVar5 = (long)(iVar6 * 0x10 + iVar2 * -0x10) >> 4;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp._M_comp._17_7_ = uStack_3f;
      __comp._M_comp.desc = bVar1;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>>>>
                (v_t + iVar2,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar7 = this->FRN;
    }
    hVar8 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>(v_t + iVar7,result);
    return hVar8;
  }
  if (iVar4 != iVar6 && iVar2 != iVar6) {
    uVar5 = (long)(iVar6 * 0x10 + iVar2 * -0x10) >> 4;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    __comp_00._M_comp._17_7_ = uStack_3f;
    __comp_00._M_comp.desc = bVar1;
    __comp_00._M_comp.accessor_r = accessor;
    __comp_00._M_comp.accessor_l = accessor;
    local_50.lower = (uint64_t)accessor;
    local_50.upper = (int64_t)accessor;
    ::std::
    __introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>>>>
              (v_t + iVar2,v_t + iVar4,v_t + iVar6,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               __comp_00);
    iVar4 = this->FRN;
    iVar7 = this->CRN;
    iVar6 = this->end;
  }
  local_50.upper = (int64_t)accessor;
  local_50.lower = (uint64_t)accessor;
  local_40 = bVar1;
  if (iVar7 != iVar6 && iVar4 != iVar6) {
    uVar5 = (long)(iVar6 * 0x10 + iVar4 * -0x10) >> 4;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    __comp_01._M_comp._17_7_ = uStack_3f;
    __comp_01._M_comp.desc = bVar1;
    __comp_01._M_comp.accessor_r = accessor;
    __comp_01._M_comp.accessor_l = accessor;
    ::std::
    __introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>>>>
              (v_t + iVar4,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               __comp_01);
    iVar4 = this->FRN;
  }
  local_50 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>(v_t + iVar4,result);
  local_38 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>(v_t + this->CRN,result);
  hVar8 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                    (&local_50,
                     this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),&local_38);
  return hVar8;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}